

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O0

void fast_fftfilt(double *x,int x_length,double *h,int h_length,int fft_size,
                 ForwardRealFFT *forward_real_fft,InverseRealFFT *inverse_real_fft,double *y)

{
  undefined1 auVar1 [16];
  fft_plan p;
  fft_plan p_00;
  fft_plan p_01;
  ulong uVar2;
  double *in_stack_fffffffffffffeb0;
  int local_134;
  undefined1 auStack_130 [4];
  int i_6;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  int local_e4;
  undefined1 auStack_e0 [4];
  int i_5;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  int local_94;
  int local_90;
  int i_4;
  int i_3;
  int i_2;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  int local_3c;
  int i_1;
  int i;
  fft_complex *x_spectrum;
  ForwardRealFFT *forward_real_fft_local;
  int fft_size_local;
  int h_length_local;
  double *h_local;
  double *pdStack_10;
  int x_length_local;
  double *x_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)fft_size;
  uVar2 = SUB168(auVar1 * ZEXT816(0x10),0);
  if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
    uVar2 = 0xffffffffffffffff;
  }
  x_spectrum = (fft_complex *)forward_real_fft;
  forward_real_fft_local._0_4_ = fft_size;
  forward_real_fft_local._4_4_ = h_length;
  _fft_size_local = h;
  h_local._4_4_ = x_length;
  pdStack_10 = x;
  _i_1 = operator_new__(uVar2);
  for (local_3c = 0; local_3c < h_local._4_4_; local_3c = local_3c + 1) {
    *(double *)((long)(*x_spectrum)[1] + (long)local_3c * 8) =
         pdStack_10[local_3c] / (double)(int)forward_real_fft_local;
  }
  for (local_40 = h_local._4_4_; local_40 < (int)forward_real_fft_local; local_40 = local_40 + 1) {
    *(undefined8 *)((long)(*x_spectrum)[1] + (long)local_40 * 8) = 0;
  }
  memcpy(&i_3,x_spectrum[1] + 1,0x48);
  p._8_8_ = local_78;
  p.n = (undefined4)uStack_80;
  p.sign = uStack_80._4_4_;
  p.c_in = (fft_complex *)uStack_70;
  p.in = (double *)local_68;
  p.c_out = (fft_complex *)uStack_60;
  p.out = (double *)local_58;
  p.input = (double *)uStack_50;
  p.ip = (int *)local_48;
  p.w = in_stack_fffffffffffffeb0;
  fft_execute(p);
  for (i_4 = 0; i_4 <= (int)forward_real_fft_local / 2; i_4 = i_4 + 1) {
    *(undefined8 *)((long)_i_1 + (long)i_4 * 0x10) =
         *(undefined8 *)((long)x_spectrum[1][0] + (long)i_4 * 0x10);
    *(undefined8 *)((long)_i_1 + (long)i_4 * 0x10 + 8) =
         *(undefined8 *)((long)x_spectrum[1][0] + (long)i_4 * 0x10 + 8);
  }
  for (local_90 = 0; local_90 < forward_real_fft_local._4_4_; local_90 = local_90 + 1) {
    *(double *)((long)(*x_spectrum)[1] + (long)local_90 * 8) =
         _fft_size_local[local_90] / (double)(int)forward_real_fft_local;
  }
  for (local_94 = forward_real_fft_local._4_4_; local_94 < (int)forward_real_fft_local;
      local_94 = local_94 + 1) {
    *(undefined8 *)((long)(*x_spectrum)[1] + (long)local_94 * 8) = 0;
  }
  memcpy(auStack_e0,x_spectrum[1] + 1,0x48);
  p_00._8_8_ = local_d0;
  p_00.n = (undefined4)uStack_d8;
  p_00.sign = uStack_d8._4_4_;
  p_00.c_in = (fft_complex *)uStack_c8;
  p_00.in = (double *)local_c0;
  p_00.c_out = (fft_complex *)uStack_b8;
  p_00.out = (double *)local_b0;
  p_00.input = (double *)uStack_a8;
  p_00.ip = (int *)local_a0;
  p_00.w = in_stack_fffffffffffffeb0;
  fft_execute(p_00);
  for (local_e4 = 0; local_e4 <= (int)forward_real_fft_local / 2; local_e4 = local_e4 + 1) {
    inverse_real_fft->spectrum[local_e4][0] =
         *(double *)((long)_i_1 + (long)local_e4 * 0x10) *
         *(double *)((long)x_spectrum[1][0] + (long)local_e4 * 0x10) +
         -(*(double *)((long)_i_1 + (long)local_e4 * 0x10 + 8) *
          *(double *)((long)x_spectrum[1][0] + (long)local_e4 * 0x10 + 8));
    inverse_real_fft->spectrum[local_e4][1] =
         *(double *)((long)_i_1 + (long)local_e4 * 0x10) *
         *(double *)((long)x_spectrum[1][0] + (long)local_e4 * 0x10 + 8) +
         *(double *)((long)_i_1 + (long)local_e4 * 0x10 + 8) *
         *(double *)((long)x_spectrum[1][0] + (long)local_e4 * 0x10);
  }
  memcpy(auStack_130,&inverse_real_fft->inverse_fft,0x48);
  p_01._8_8_ = local_120;
  p_01.n = (undefined4)uStack_128;
  p_01.sign = uStack_128._4_4_;
  p_01.c_in = (fft_complex *)uStack_118;
  p_01.in = (double *)local_110;
  p_01.c_out = (fft_complex *)uStack_108;
  p_01.out = (double *)local_100;
  p_01.input = (double *)uStack_f8;
  p_01.ip = (int *)local_f0;
  p_01.w = in_stack_fffffffffffffeb0;
  fft_execute(p_01);
  for (local_134 = 0; local_134 < (int)forward_real_fft_local; local_134 = local_134 + 1) {
    y[local_134] = inverse_real_fft->waveform[local_134];
  }
  if (_i_1 != (void *)0x0) {
    operator_delete__(_i_1);
  }
  return;
}

Assistant:

void fast_fftfilt(const double *x, int x_length, const double *h, int h_length,
    int fft_size, const ForwardRealFFT *forward_real_fft,
    const InverseRealFFT *inverse_real_fft, double *y) {
  fft_complex *x_spectrum = new fft_complex[fft_size];

  for (int i = 0; i < x_length; ++i)
    forward_real_fft->waveform[i] = x[i] / fft_size;
  for (int i = x_length; i < fft_size; ++i)
    forward_real_fft->waveform[i] = 0.0;
  fft_execute(forward_real_fft->forward_fft);
  for (int i = 0; i <= fft_size / 2; ++i) {
    x_spectrum[i][0] = forward_real_fft->spectrum[i][0];
    x_spectrum[i][1] = forward_real_fft->spectrum[i][1];
  }

  for (int i = 0; i < h_length; ++i)
    forward_real_fft->waveform[i] = h[i] / fft_size;
  for (int i = h_length; i < fft_size; ++i)
    forward_real_fft->waveform[i] = 0.0;
  fft_execute(forward_real_fft->forward_fft);

  for (int i = 0; i <= fft_size / 2; ++i) {
    inverse_real_fft->spectrum[i][0] =
      x_spectrum[i][0] * forward_real_fft->spectrum[i][0] -
      x_spectrum[i][1] * forward_real_fft->spectrum[i][1];
    inverse_real_fft->spectrum[i][1] =
      x_spectrum[i][0] * forward_real_fft->spectrum[i][1] +
      x_spectrum[i][1] * forward_real_fft->spectrum[i][0];
  }
  fft_execute(inverse_real_fft->inverse_fft);

  for (int i = 0; i < fft_size; ++i)
    y[i] = inverse_real_fft->waveform[i];

  delete[] x_spectrum;
}